

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O3

int __thiscall ncnn::SPP::forward(SPP *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  int j;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int k;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  float fVar16;
  int iVar17;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar18;
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  allocator_type local_f9;
  undefined8 local_f8;
  undefined8 uStack_f0;
  void *local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  SPP *local_b8;
  long local_b0;
  void *local_a8;
  void *local_a0;
  Mat local_98;
  Option *local_58;
  Mat *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_b8 = this;
  local_58 = opt;
  Mat::create(top_blob,(int)((ulong)(uint)~(-1 << ((char)this->pyramid_height * '\x02' & 0x1fU)) *
                             0x55555556 >> 0x20),1,2,bottom_blob->elemsize,opt->blob_allocator);
  local_e0 = top_blob->data;
  iVar7 = -100;
  if ((local_e0 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < local_b8->pyramid_height) {
      uVar12 = 0;
      local_50 = bottom_blob;
      do {
        uVar8 = 1 << ((byte)uVar12 & 0x1f);
        uVar14 = bottom_blob->c;
        uVar9._0_4_ = bottom_blob->w;
        uVar9._4_4_ = bottom_blob->h;
        uStack_f0 = 0;
        fStack_bc = 1.0 / (float)(int)uVar8;
        local_c8._0_4_ = fStack_bc * (float)(int)(undefined4)uVar9;
        local_c8._4_4_ = fStack_bc * (float)(int)uVar9._4_4_;
        fStack_c0 = fStack_bc * 0.0;
        fStack_bc = fStack_bc * 0.0;
        local_f8 = uVar9;
        fVar16 = ceilf((float)local_c8);
        local_d8 = CONCAT44(extraout_XMM0_Db,fVar16);
        fVar16 = ceilf(local_c8._4_4_);
        local_98.data = bottom_blob->data;
        local_98.refcount = bottom_blob->refcount;
        local_98.elemsize = bottom_blob->elemsize;
        local_98.elempack = bottom_blob->elempack;
        local_98.allocator = bottom_blob->allocator;
        local_98.dims = bottom_blob->dims;
        local_98.cstep = bottom_blob->cstep;
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        iVar20 = (int)(float)local_d8;
        iVar21 = (int)fVar16;
        iVar17 = (iVar20 << (int)uVar12) - (int)local_f8;
        iVar18 = iVar21 - local_f8._4_4_;
        auVar19._0_4_ = -(uint)(0 < iVar17);
        auVar19._4_4_ = -(uint)(0 < iVar17);
        auVar19._8_4_ = -(uint)(0 < iVar18);
        auVar19._12_4_ = -(uint)(0 < iVar18);
        iVar4 = movmskpd((int)local_98.refcount,auVar19);
        iVar7 = (int)local_f8;
        local_c8 = (ulong)uVar14;
        local_98._44_8_ = uVar9;
        local_98.c = uVar14;
        if (iVar4 == 0) {
LAB_0014b79c:
          uVar14 = iVar21 * iVar20;
          local_d8 = uVar12;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar14,&local_f9);
          uVar12 = local_d8;
          if (0 < iVar21) {
            iVar4 = 0;
            iVar17 = 0;
            iVar18 = 0;
            do {
              if (0 < iVar20) {
                lVar11 = 0;
                do {
                  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar18 + lVar11] = iVar17 + (int)lVar11;
                  lVar11 = lVar11 + 1;
                  iVar10 = (int)lVar11;
                } while (iVar20 != iVar10);
                iVar18 = iVar18 + iVar10;
                iVar17 = iVar17 + iVar10;
              }
              iVar17 = iVar17 + (iVar7 - iVar20);
              iVar4 = iVar4 + 1;
            } while (iVar4 != iVar21);
          }
          bVar6 = (byte)local_d8;
          if (local_b8->pooling_type == 0) {
            if (0 < (int)(float)local_c8) {
              local_a0 = local_98.data;
              local_a8 = (void *)(local_98.cstep * local_98.elemsize);
              uVar2 = uVar8;
              if ((int)uVar8 < 2) {
                uVar2 = 1;
              }
              local_b0 = (long)(int)(uVar8 << (bVar6 & 0x1f));
              local_f8 = 0;
              do {
                if ((float)local_d8 != 4.34403e-44) {
                  pvVar15 = (void *)((long)local_e0 + local_f8 * local_b0 * 4);
                  uVar9 = 0;
                  do {
                    lVar11 = (long)(iVar7 * iVar21 * (int)uVar9) * 4 + (long)local_a8 * local_f8;
                    uVar5 = 0;
                    do {
                      fVar16 = *(float *)((long)local_98.data + uVar5 * (long)iVar20 * 4 + lVar11);
                      if (0 < (int)uVar14) {
                        uVar13 = 0;
                        do {
                          fVar1 = *(float *)((long)local_98.data +
                                            (long)_space_ofs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar13] *
                                            4 + uVar5 * (long)iVar20 * 4 + lVar11);
                          if (fVar16 <= fVar1) {
                            fVar16 = fVar1;
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar14 != uVar13);
                      }
                      *(float *)((long)pvVar15 + uVar5 * 4) = fVar16;
                      uVar5 = uVar5 + 1;
                    } while (uVar5 != uVar2);
                    pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar8 * 4);
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != uVar2);
                }
                local_f8 = local_f8 + 1;
              } while (local_f8 != local_c8);
            }
          }
          else if ((local_b8->pooling_type == 1) && (0 < (int)(float)local_c8)) {
            local_a0 = (void *)(local_98.cstep * local_98.elemsize);
            local_a8 = local_98.data;
            uVar2 = uVar8;
            if ((int)uVar8 < 2) {
              uVar2 = 1;
            }
            local_b0 = (long)(int)(uVar8 << (bVar6 & 0x1f));
            local_f8 = 0;
            do {
              if ((float)local_d8 != 4.34403e-44) {
                pvVar15 = (void *)((long)local_e0 + local_f8 * local_b0 * 4);
                uVar9 = 0;
                do {
                  uVar5 = 0;
                  do {
                    if ((int)uVar14 < 1) {
                      fVar16 = 0.0;
                    }
                    else {
                      fVar16 = 0.0;
                      uVar13 = 0;
                      do {
                        fVar16 = fVar16 + *(float *)((long)local_98.data +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar13] *
                                                  4 + uVar5 * (long)iVar20 * 4 +
                                                      (long)(iVar7 * iVar21 * (int)uVar9) * 4 +
                                                      (long)local_a0 * local_f8);
                        uVar13 = uVar13 + 1;
                      } while (uVar14 != uVar13);
                    }
                    *(float *)((long)pvVar15 + uVar5 * 4) = fVar16 * (1.0 / (float)(int)uVar14);
                    uVar5 = uVar5 + 1;
                  } while (uVar5 != uVar2);
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar8 * 4);
                  uVar9 = uVar9 + 1;
                } while (uVar9 != uVar2);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_c8);
          }
          iVar7 = (int)(float)local_c8 << (bVar6 & 0x1f);
          if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          local_e0 = (void *)((long)local_e0 + (long)(iVar7 << (bVar6 & 0x1f)) * 4);
          bVar3 = true;
          bottom_blob = local_50;
        }
        else {
          local_f8 = CONCAT44(iVar21,iVar20);
          uStack_f0 = CONCAT44((int)extraout_XMM0_Db_00,(int)local_d8._4_4_);
          iVar20 = (iVar17 - (iVar17 + 1 >> 0x1f)) + 1 >> 1;
          iVar7 = (iVar18 - (iVar18 + 1 >> 0x1f)) + 1 >> 1;
          copy_make_border(bottom_blob,&local_98,iVar7,iVar7,iVar20,iVar20,0,0.0,local_58);
          if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
            iVar7 = local_98.w;
            iVar20 = (int)local_f8;
            iVar21 = local_f8._4_4_;
            goto LAB_0014b79c;
          }
          bVar3 = false;
        }
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if (*local_98.refcount == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (**(code **)(*(long *)local_98.allocator + 0x18))();
            }
          }
        }
        if (!bVar3) {
          return -100;
        }
        uVar14 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar14;
      } while ((int)uVar14 < local_b8->pyramid_height);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int SPP::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;

    // 1 + 4 + 16 + 64 + ... + (2*pyramid_height)^2
    int pyramid_num_bins = ((1 << (pyramid_height * 2)) - 1) / 3;
    top_blob.create(pyramid_num_bins, 1, 2, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* pyramid_ptr = top_blob;

    // all spatial pyramids
    for (int p = 0; p < pyramid_height; p++)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int num_bins = 1 << p;

        int kernel_h = ceil(h / (float)num_bins);
        int stride_h = kernel_h;
        int remainder_h = stride_h * num_bins - h;
        int pad_h = (remainder_h + 1) / 2;

        int kernel_w = ceil(w / (float)num_bins);
        int stride_w = kernel_w;
        int remainder_w = stride_w * num_bins - w;
        int pad_w = (remainder_w + 1) / 2;

        // max value in NxN window
        // avg value in NxN window

        int outw = num_bins;
        int outh = num_bins;

        Mat bottom_blob_bordered = bottom_blob;
        if (pad_h > 0 || pad_w > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt);
            if (bottom_blob_bordered.empty())
                return -100;

            w = bottom_blob_bordered.w;
            h = bottom_blob_bordered.h;
        }

        const int maxk = kernel_h * kernel_w;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float max = sptr[0];

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            max = std::max(max, val);
                        }

                        outptr[j] = max;
                    }

                    outptr += outw;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }

        pyramid_ptr += channels * outh * outw;
    }

    return 0;
}